

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall despot::BaseRockSample::PrintState(BaseRockSample *this,State *state,ostream *out)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  int *piVar4;
  ostream *poVar5;
  int x;
  int iVar6;
  char *pcVar7;
  int x_1;
  int iVar8;
  undefined8 local_48;
  Coord local_40 [8];
  Coord pos;
  
  std::endl<char,std::char_traits<char>>(out);
  for (iVar6 = 0; iVar6 < this->size_ + 2; iVar6 = iVar6 + 1) {
    std::operator<<(out,"# ");
  }
  std::endl<char,std::char_traits<char>>(out);
  iVar6 = this->size_;
  while (0 < iVar6) {
    iVar6 = iVar6 + -1;
    std::operator<<(out,"# ");
    for (iVar8 = 0; iVar8 < this->size_; iVar8 = iVar8 + 1) {
      despot::Coord::Coord(&pos,iVar8,iVar6);
      piVar4 = Grid<int>::operator()(&this->grid_,&pos);
      iVar1 = *piVar4;
      uVar2 = *(uint *)(state + 0xc);
      local_48 = GetRobPos(this,state);
      despot::Coord::Coord(local_40,iVar8,iVar6);
      cVar3 = despot::operator==((Coord *)&local_48,local_40);
      poVar5 = out;
      if (cVar3 == '\0') {
        if (iVar1 < 0) {
          pcVar7 = ". ";
        }
        else {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)out,iVar1);
          pcVar7 = "$";
          if ((1 << ((byte)iVar1 & 0x1f) & uVar2) == 0) {
            pcVar7 = "X";
          }
        }
      }
      else {
        pcVar7 = "R ";
      }
      std::operator<<(poVar5,pcVar7);
    }
    poVar5 = std::operator<<(out,"#");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  for (iVar6 = 0; iVar6 < this->size_ + 2; iVar6 = iVar6 + 1) {
    std::operator<<(out,"# ");
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void BaseRockSample::PrintState(const State& state, ostream& out) const {
	out << endl;
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
	for (int y = size_ - 1; y >= 0; y--) {
		out << "# ";
		for (int x = 0; x < size_; x++) {
			Coord pos(x, y);
			int rock = grid_(pos);
			int status = GetRock(&state, rock);
			if (GetRobPos(&state) == Coord(x, y))
				out << "R ";
			else if (rock >= 0)
				out << rock << (status ? "$" : "X");
			else
				out << ". ";
		}
		out << "#" << endl;
	}
	for (int x = 0; x < size_ + 2; x++)
		out << "# ";
	out << endl;
}